

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

void __thiscall crnlib::dxt1_endpoint_optimizer::compute_selectors_hc(dxt1_endpoint_optimizer *this)

{
  vector<unsigned_char> *this_00;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  unique_color *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  color_quad_u8 c1;
  color_quad_u8 c0;
  undefined1 local_4c [5];
  byte local_47;
  byte local_46;
  
  this_00 = &(this->m_best_solution).m_selectors;
  uVar5 = (this->m_unique_colors).m_size;
  uVar6 = (this->m_best_solution).m_selectors.m_size;
  if (uVar6 != uVar5) {
    if (uVar6 <= uVar5) {
      if ((this->m_best_solution).m_selectors.m_capacity < uVar5) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar5,uVar6 + 1 == uVar5,1,(object_mover)0x0,false);
        uVar6 = (this->m_best_solution).m_selectors.m_size;
      }
      memset(this_00->m_p + uVar6,0,(ulong)(uVar5 - uVar6));
    }
    (this->m_best_solution).m_selectors.m_size = uVar5;
  }
  if ((this->m_best_solution).m_enforce_selector == true) {
    memset((this->m_best_solution).m_selectors.m_p,(uint)(this->m_best_solution).m_enforced_selector
           ,(ulong)uVar5);
    return;
  }
  dxt1_block::unpack_color
            ((dxt1_block *)(local_4c + 4),(this->m_best_solution).m_coords.m_low_color,true,0xff);
  dxt1_block::unpack_color
            ((dxt1_block *)local_4c,(this->m_best_solution).m_coords.m_high_color,true,0xff);
  uVar8 = (ulong)(this->m_unique_colors).m_size;
  if (uVar8 != 0) {
    bVar1 = (this->m_best_solution).m_alternate_rounding;
    uVar5 = ((uint)local_46 + (uint)bVar1 + (uint)local_4c[2] * 2) / 3;
    uVar6 = ((uint)local_47 + (uint)bVar1 + (uint)local_4c[1] * 2) / 3;
    uVar7 = ((uint)local_4c[4] + (uint)local_4c[0] * 2 + (uint)bVar1) / 3;
    uVar12 = ((uint)local_4c[2] + (uint)bVar1 + (uint)local_46 * 2) / 3;
    uVar13 = ((uint)local_4c[1] + (uint)bVar1 + (uint)local_47 * 2) / 3;
    uVar14 = ((uint)local_4c[0] + (uint)local_4c[4] * 2 + (uint)bVar1) / 3;
    uVar15 = 0;
    do {
      puVar4 = (this->m_unique_colors).m_p;
      bVar9 = puVar4[uVar15].m_color.field_0.field_0.r;
      uVar11 = (uint)bVar9;
      bVar2 = puVar4[uVar15].m_color.field_0.field_0.g;
      uVar18 = (uint)bVar2;
      bVar3 = puVar4[uVar15].m_color.field_0.field_0.b;
      uVar10 = (uint)bVar3;
      iVar16 = (uint)bVar9 - (uint)local_4c[4];
      iVar19 = (uint)bVar2 - (uint)local_47;
      iVar21 = (uint)bVar3 - (uint)local_46;
      if (this->m_perceptual == true) {
        uVar22 = iVar21 * iVar21 + iVar19 * iVar19 * 0x19 + iVar16 * iVar16 * 8;
        uVar20 = (uVar10 - local_4c[2]) * (uVar10 - local_4c[2]) +
                 (uVar18 - local_4c[1]) * (uVar18 - local_4c[1]) * 0x19 +
                 (uVar11 - local_4c[0]) * (uVar11 - local_4c[0]) * 8;
        iVar16 = uVar11 - uVar14;
        iVar19 = uVar18 - uVar13;
        iVar21 = uVar10 - uVar12;
        uVar17 = iVar21 * iVar21 + iVar19 * iVar19 * 0x19 + iVar16 * iVar16 * 8;
        iVar16 = uVar11 - uVar7;
        iVar21 = uVar18 - uVar6;
        iVar19 = uVar10 - uVar5;
        uVar11 = iVar19 * iVar19 + iVar21 * iVar21 * 0x19 + iVar16 * iVar16 * 8;
      }
      else {
        uVar22 = iVar21 * iVar21 + iVar19 * iVar19 + iVar16 * iVar16;
        iVar21 = (uint)bVar9 - (uint)local_4c[0];
        iVar16 = (uint)bVar2 - (uint)local_4c[1];
        iVar19 = (uint)bVar3 - (uint)local_4c[2];
        uVar20 = iVar19 * iVar19 + iVar16 * iVar16 + iVar21 * iVar21;
        iVar16 = uVar11 - uVar14;
        iVar19 = uVar18 - uVar13;
        iVar21 = uVar10 - uVar12;
        uVar17 = iVar21 * iVar21 + iVar19 * iVar19 + iVar16 * iVar16;
        iVar16 = uVar11 - uVar7;
        iVar21 = uVar18 - uVar6;
        iVar19 = uVar10 - uVar5;
        uVar11 = iVar19 * iVar19 + iVar21 * iVar21 + iVar16 * iVar16;
      }
      uVar10 = uVar20;
      if (uVar22 < uVar20) {
        uVar10 = uVar22;
      }
      uVar18 = uVar11;
      if (uVar17 < uVar11) {
        uVar18 = uVar17;
      }
      bVar9 = uVar11 < uVar17 | 2;
      if (uVar10 <= uVar18) {
        bVar9 = uVar20 < uVar22;
      }
      this_00->m_p[uVar15] = bVar9;
      uVar15 = uVar15 + 1;
    } while (uVar8 != uVar15);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_selectors_hc() {
  m_best_solution.m_selectors.resize(m_unique_colors.size());
  if (m_best_solution.m_enforce_selector) {
    memset(m_best_solution.m_selectors.get_ptr(), m_best_solution.m_enforced_selector, m_best_solution.m_selectors.size());
    return;
  }
  color_quad_u8 c0 = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true);
  color_quad_u8 c1 = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true);
  color_quad_u8 c2((c0.r * 2 + c1.r + m_best_solution.m_alternate_rounding) / 3, (c0.g * 2 + c1.g + m_best_solution.m_alternate_rounding) / 3, (c0.b * 2 + c1.b + m_best_solution.m_alternate_rounding) / 3, 0);
  color_quad_u8 c3((c1.r * 2 + c0.r + m_best_solution.m_alternate_rounding) / 3, (c1.g * 2 + c0.g + m_best_solution.m_alternate_rounding) / 3, (c1.b * 2 + c0.b + m_best_solution.m_alternate_rounding) / 3, 0);
  for (uint i = 0, iEnd = m_unique_colors.size(); i < iEnd; i++) {
    const color_quad_u8& c = m_unique_colors[i].m_color;
    uint e0 = color::color_distance(m_perceptual, c, c0, false);
    uint e1 = color::color_distance(m_perceptual, c, c1, false);
    uint e2 = color::color_distance(m_perceptual, c, c2, false);
    uint e3 = color::color_distance(m_perceptual, c, c3, false);
    uint e01 = math::minimum(e0, e1);
    uint e23 = math::minimum(e2, e3);
    m_best_solution.m_selectors[i] = e01 <= e23 ? e01 == e0 ? 0 : 1 : e23 == e2 ? 2 : 3;
  }
}